

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

int Gia_ManIsNormalized(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  int local_1c;
  int nOffset;
  int i;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar1 = Gia_ManCiNum(p);
    if (iVar1 <= local_1c) {
      iVar1 = Gia_ManCiNum(p);
      iVar2 = Gia_ManAndNum(p);
      local_1c = 0;
      while( true ) {
        iVar3 = Gia_ManCoNum(p);
        if (iVar3 <= local_1c) {
          return 1;
        }
        pGVar4 = Gia_ManObj(p,iVar1 + 1 + iVar2 + local_1c);
        iVar3 = Gia_ObjIsCo(pGVar4);
        if (iVar3 == 0) break;
        local_1c = local_1c + 1;
      }
      return 0;
    }
    pGVar4 = Gia_ManObj(p,local_1c + 1);
    iVar1 = Gia_ObjIsCi(pGVar4);
    if (iVar1 == 0) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

int Gia_ManIsNormalized( Gia_Man_t * p )  
{
    int i, nOffset;
    nOffset = 1;
    for ( i = 0; i < Gia_ManCiNum(p); i++ )
        if ( !Gia_ObjIsCi( Gia_ManObj(p, nOffset+i) ) )
            return 0;
    nOffset = 1 + Gia_ManCiNum(p) + Gia_ManAndNum(p);
    for ( i = 0; i < Gia_ManCoNum(p); i++ )
        if ( !Gia_ObjIsCo( Gia_ManObj(p, nOffset+i) ) )
            return 0;
    return 1;
}